

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMini.c
# Opt level: O1

Abc_Obj_t * Abc_NodeFanin1Copy(Abc_Ntk_t *pNtk,Vec_Int_t *vCopies,Mini_Aig_t *p,int Id)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = Mini_AigNodeFanin1(p,Id);
  if ((int)uVar2 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10c,"int Abc_Lit2Var(int)");
  }
  if (vCopies->nSize <= (int)(uVar2 >> 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar1 = vCopies->pArray[uVar2 >> 1];
  if ((int)uVar1 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10f,"int Abc_LitNotCond(int, int)");
  }
  if ((int)(uVar1 >> 1) < pNtk->vObjs->nSize) {
    return (Abc_Obj_t *)((ulong)((uVar1 ^ uVar2) & 1) ^ (ulong)pNtk->vObjs->pArray[uVar1 >> 1]);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Obj_t * Abc_NodeFanin1Copy( Abc_Ntk_t * pNtk, Vec_Int_t * vCopies, Mini_Aig_t * p, int Id )
{
    int Lit = Mini_AigNodeFanin1( p, Id );
    int AbcLit = Abc_LitNotCond( Vec_IntEntry(vCopies, Abc_Lit2Var(Lit)), Abc_LitIsCompl(Lit) );
    return Abc_ObjFromLit( pNtk, AbcLit );
}